

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O3

void __thiscall
google::protobuf::util::anon_unknown_0::
DescriptorPoolTypeResolverSyntaxTest_EditionsEnumFeatures_Test::
~DescriptorPoolTypeResolverSyntaxTest_EditionsEnumFeatures_Test
          (DescriptorPoolTypeResolverSyntaxTest_EditionsEnumFeatures_Test *this)

{
  TypeResolver *pTVar1;
  
  (this->super_DescriptorPoolTypeResolverSyntaxTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DescriptorPoolTypeResolverSyntaxTest_018f67d0;
  pTVar1 = (this->super_DescriptorPoolTypeResolverSyntaxTest).resolver_._M_t.
           super___uniq_ptr_impl<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::TypeResolver_*,_std::default_delete<google::protobuf::util::TypeResolver>_>
           .super__Head_base<0UL,_google::protobuf::util::TypeResolver_*,_false>._M_head_impl;
  if (pTVar1 != (TypeResolver *)0x0) {
    (*pTVar1->_vptr_TypeResolver[1])();
  }
  (this->super_DescriptorPoolTypeResolverSyntaxTest).resolver_._M_t.
  super___uniq_ptr_impl<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::TypeResolver_*,_std::default_delete<google::protobuf::util::TypeResolver>_>
  .super__Head_base<0UL,_google::protobuf::util::TypeResolver_*,_false>._M_head_impl =
       (TypeResolver *)0x0;
  DescriptorPool::~DescriptorPool(&(this->super_DescriptorPoolTypeResolverSyntaxTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x90);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverSyntaxTest, EditionsEnumFeatures) {
  BuildFile(R"pb(
    package: "test"
    name: "foo"
    syntax: "editions"
    edition: EDITION_2023
    enum_type {
      name: "MyEnum"
      value: { name: "FOO" number: 1 }
      options { features { enum_type: CLOSED } }
    }
  )pb");

  Enum enm;
  ASSERT_TRUE(resolver_->ResolveEnumType(GetTypeUrl("test.MyEnum"), &enm).ok());
  EXPECT_THAT(
      enm, EqualsProto(R"pb(
        name: "test.MyEnum"
        enumvalue { name: "FOO" number: 1 }
        options {
          name: "features"
          value {
            [type.googleapis.com/google.protobuf.FeatureSet] { enum_type: CLOSED }
          }
        }
        source_context { file_name: "foo" }
        syntax: SYNTAX_EDITIONS
        edition: "2023"
      )pb"));
}